

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

void device_cancel(nni_aio *aio,void *arg,int rv)

{
  int local_2c;
  int i;
  device_data *d;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  nni_mtx_lock(&device_mtx);
  if (*arg == aio) {
    for (local_2c = 0; local_2c < *(int *)((long)arg + 8); local_2c = local_2c + 1) {
      nni_aio_abort((nni_aio *)((long)arg + (long)local_2c * 0x1e8 + 0x38),rv);
    }
  }
  nni_mtx_unlock(&device_mtx);
  return;
}

Assistant:

static void
device_cancel(nni_aio *aio, void *arg, int rv)
{
	device_data *d = arg;
	// cancellation is the only path to shutting it down.

	nni_mtx_lock(&device_mtx);
	if (d->user == aio) {
		for (int i = 0; i < d->num_paths; i++) {
			nni_aio_abort(&d->paths[i].aio, rv);
		}
	}
	nni_mtx_unlock(&device_mtx);
}